

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O2

void __thiscall
Assimp::COBImporter::ReadMat1_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  pointer pMVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  Logger *pLVar7;
  ai_real aVar8;
  string shader;
  char *local_1d0 [4];
  char *rgb;
  char *tokens [10];
  
  if (8 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Mat1");
    return;
  }
  LineSplitter::operator++(splitter);
  bVar4 = LineSplitter::match_start(splitter,"mat# ");
  if (bVar4) {
    tokens[2] = (char *)(tokens + 4);
    tokens[0] = (char *)0x0;
    tokens[1] = (char *)0xffffffff00000000;
    tokens[3] = (char *)0x0;
    tokens[4]._0_1_ = 0;
    tokens[6] = (char *)0x0;
    tokens[7]._0_4_ = 0;
    tokens[7]._4_4_ = 0;
    tokens[8]._0_4_ = 0;
    tokens[8]._4_4_ = 0;
    tokens[9]._0_4_ = 0;
    tokens[9]._4_4_ = 0x3f800000;
    std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>::
    emplace_back<Assimp::COB::Material>(&out->materials,(Material *)tokens);
    COB::Material::~Material((Material *)tokens);
    pMVar1 = (out->materials).
             super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar5 = nfo->parent_id;
    uVar2 = nfo->version;
    uVar3 = nfo->size;
    pMVar1[-1].super_ChunkInfo.id = nfo->id;
    pMVar1[-1].super_ChunkInfo.parent_id = uVar5;
    pMVar1[-1].super_ChunkInfo.version = uVar2;
    pMVar1[-1].super_ChunkInfo.size = uVar3;
    pcVar6 = LineSplitter::operator[](splitter,1);
    uVar5 = strtoul10(pcVar6,(char **)0x0);
    pMVar1[-1].matnum = uVar5;
    LineSplitter::operator++(splitter);
    bVar4 = LineSplitter::match_start(splitter,"shader: ");
    if (bVar4) {
      pcVar6 = LineSplitter::operator[](splitter,1);
      std::__cxx11::string::string((string *)&shader,pcVar6,(allocator *)tokens);
      std::__cxx11::string::find_first_of((char *)&shader,0x5b36ac);
      std::__cxx11::string::substr((ulong)tokens,(ulong)&shader);
      std::__cxx11::string::operator=((string *)&shader,(string *)tokens);
      std::__cxx11::string::~string((string *)tokens);
      bVar4 = std::operator==(&shader,"metal");
      if (bVar4) {
        pMVar1[-1].shader = METAL;
      }
      else {
        bVar4 = std::operator==(&shader,"phong");
        if (bVar4) {
          pMVar1[-1].shader = PHONG;
        }
        else {
          bVar4 = std::operator!=(&shader,"flat");
          if (bVar4) {
            pLVar7 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[44]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       tokens,(char (*) [44])"Unknown value for `shader` in `Mat1` chunk ");
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                      ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)tokens,
                       &nfo->id);
            std::__cxx11::stringbuf::str();
            Logger::warn(pLVar7,local_1d0[0]);
            std::__cxx11::string::~string((string *)local_1d0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)tokens);
          }
        }
      }
      LineSplitter::operator++(splitter);
      bVar4 = LineSplitter::match_start(splitter,"rgb ");
      if (!bVar4) {
        pLVar7 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[37]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)tokens,
                   (char (*) [37])"Expected `rgb` line in `Mat1` chunk ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)tokens,
                   &nfo->id);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar7,local_1d0[0]);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)tokens);
      }
      rgb = LineSplitter::operator[](splitter,1);
      ReadFloat3Tuple_Ascii<aiColor3D>(this,&pMVar1[-1].rgb,&rgb);
      LineSplitter::operator++(splitter);
      bVar4 = LineSplitter::match_start(splitter,"alpha ");
      if (!bVar4) {
        pLVar7 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[39]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)tokens,
                   (char (*) [39])"Expected `alpha` line in `Mat1` chunk ");
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)tokens,
                   &nfo->id);
        std::__cxx11::stringbuf::str();
        Logger::warn(pLVar7,local_1d0[0]);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)tokens);
      }
      LineSplitter::get_tokens<10ul>(splitter,&tokens);
      aVar8 = fast_atof(tokens[1]);
      pMVar1[-1].alpha = aVar8;
      aVar8 = fast_atof(tokens[3]);
      pMVar1[-1].ka = aVar8;
      aVar8 = fast_atof(tokens[5]);
      pMVar1[-1].ks = aVar8;
      aVar8 = fast_atof((char *)CONCAT44(tokens[7]._4_4_,tokens[7]._0_4_));
      pMVar1[-1].exp = aVar8;
      aVar8 = fast_atof((char *)CONCAT44(tokens[9]._4_4_,tokens[9]._0_4_));
      pMVar1[-1].ior = aVar8;
      std::__cxx11::string::~string((string *)&shader);
      return;
    }
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[38]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)tokens,
               (char (*) [38])"Expected `mat#` line in `Mat1` chunk ");
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)tokens,&nfo->id)
    ;
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar7,shader._M_dataplus._M_p);
  }
  else {
    pLVar7 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[38]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)tokens,
               (char (*) [38])"Expected `mat#` line in `Mat1` chunk ");
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator_
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)tokens,&nfo->id)
    ;
    std::__cxx11::stringbuf::str();
    Logger::warn(pLVar7,shader._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&shader);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)tokens);
  return;
}

Assistant:

void COBImporter::ReadMat1_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Mat1");
    }

    ++splitter;
    if (!splitter.match_start("mat# ")) {
        ASSIMP_LOG_WARN_F( "Expected `mat#` line in `Mat1` chunk ", nfo.id );
        return;
    }

    out.materials.push_back(Material());
    Material& mat = out.materials.back();
    mat = nfo;

    mat.matnum = strtoul10(splitter[1]);
    ++splitter;

    if (!splitter.match_start("shader: ")) {
        ASSIMP_LOG_WARN_F( "Expected `mat#` line in `Mat1` chunk ", nfo.id);
        return;
    }
    std::string shader = std::string(splitter[1]);
    shader = shader.substr(0,shader.find_first_of(" \t"));

    if (shader == "metal") {
        mat.shader = Material::METAL;
    }
    else if (shader == "phong") {
        mat.shader = Material::PHONG;
    }
    else if (shader != "flat") {
        ASSIMP_LOG_WARN_F( "Unknown value for `shader` in `Mat1` chunk ", nfo.id );
    }

    ++splitter;
    if (!splitter.match_start("rgb ")) {
        ASSIMP_LOG_WARN_F( "Expected `rgb` line in `Mat1` chunk ", nfo.id);
    }

    const char* rgb = splitter[1];
    ReadFloat3Tuple_Ascii(mat.rgb,&rgb);

    ++splitter;
    if (!splitter.match_start("alpha ")) {
        ASSIMP_LOG_WARN_F( "Expected `alpha` line in `Mat1` chunk ", nfo.id);
    }

    const char* tokens[10];
    splitter.get_tokens(tokens);

    mat.alpha   = fast_atof( tokens[1] );
    mat.ka      = fast_atof( tokens[3] );
    mat.ks      = fast_atof( tokens[5] );
    mat.exp     = fast_atof( tokens[7] );
    mat.ior     = fast_atof( tokens[9] );
}